

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_soft.c
# Opt level: O1

void shader_texture_grad_any_first(uintptr_t state,int x1,int y,int left_minor,int left_major)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  shader_texture_solid_any_first(state,x1,y,left_minor,left_major);
  fVar9 = (float)x1 - *(float *)(state + 0x60);
  fVar10 = (float)y - *(float *)(state + 100);
  fVar1 = *(float *)(state + 0x78);
  fVar2 = *(float *)(state + 0x7c);
  fVar3 = *(float *)(state + 0x80);
  fVar4 = *(float *)(state + 0x84);
  fVar5 = *(float *)(state + 0x88);
  fVar6 = *(float *)(state + 0x8c);
  fVar7 = *(float *)(state + 0x90);
  fVar8 = *(float *)(state + 0x94);
  fVar11 = (float)left_minor;
  *(float *)(state + 8) = fVar9 * fVar1 + fVar10 * fVar5 + *(float *)(state + 0x98);
  *(float *)(state + 0xc) = fVar9 * fVar2 + fVar10 * fVar6 + *(float *)(state + 0x9c);
  *(float *)(state + 0x10) = fVar9 * fVar3 + fVar10 * fVar7 + *(float *)(state + 0xa0);
  *(float *)(state + 0x14) = fVar9 * fVar4 + fVar10 * fVar8 + *(float *)(state + 0xa4);
  *(float *)(state + 0xa8) = fVar11 * fVar1 + fVar5;
  *(float *)(state + 0xac) = fVar11 * fVar2 + fVar6;
  *(float *)(state + 0xb0) = fVar11 * fVar3 + fVar7;
  *(float *)(state + 0xb4) = fVar11 * fVar4 + fVar8;
  fVar9 = (float)left_major;
  *(float *)(state + 0xb8) = fVar9 * fVar1 + fVar5;
  *(float *)(state + 0xbc) = fVar9 * fVar2 + fVar6;
  *(float *)(state + 0xc0) = fVar9 * fVar3 + fVar7;
  *(float *)(state + 0xc4) = fVar9 * fVar4 + fVar8;
  return;
}

Assistant:

static void shader_texture_grad_any_first(uintptr_t state, int x1, int y, int left_minor, int left_major)
{
   state_texture_grad_any_2d* s = (state_texture_grad_any_2d*)state;
   float cur_x;
   float cur_y;

   shader_texture_solid_any_first(state, x1, y, left_minor, left_major);

   cur_x = (float)x1 - s->solid.off_x;
   cur_y = (float)y - s->solid.off_y;

   s->solid.cur_color.r = cur_x * s->color_dx.r + cur_y * s->color_dy.r + s->color_const.r;
   s->solid.cur_color.g = cur_x * s->color_dx.g + cur_y * s->color_dy.g + s->color_const.g;
   s->solid.cur_color.b = cur_x * s->color_dx.b + cur_y * s->color_dy.b + s->color_const.b;
   s->solid.cur_color.a = cur_x * s->color_dx.a + cur_y * s->color_dy.a + s->color_const.a;

   s->minor_color.r = (float)left_minor * s->color_dx.r + s->color_dy.r;
   s->minor_color.g = (float)left_minor * s->color_dx.g + s->color_dy.g;
   s->minor_color.b = (float)left_minor * s->color_dx.b + s->color_dy.b;
   s->minor_color.a = (float)left_minor * s->color_dx.a + s->color_dy.a;

   s->major_color.r = (float)left_major * s->color_dx.r + s->color_dy.r;
   s->major_color.g = (float)left_major * s->color_dx.g + s->color_dy.g;
   s->major_color.b = (float)left_major * s->color_dx.b + s->color_dy.b;
   s->major_color.a = (float)left_major * s->color_dx.a + s->color_dy.a;
}